

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtooltip.cpp
# Opt level: O1

void __thiscall QTipLabel::placeTip(QTipLabel *this,QPoint *pos,QWidget *w)

{
  long lVar1;
  QWidgetData *pQVar2;
  QTipLabel *pQVar3;
  QWidget *pQVar4;
  bool bVar5;
  long lVar6;
  undefined4 *puVar7;
  QScreen *pQVar8;
  QPlatformScreen *context;
  long *plVar9;
  QSize QVar10;
  int iVar11;
  Representation RVar12;
  int iVar13;
  int iVar14;
  long in_FS_OFFSET;
  undefined1 auVar15 [16];
  QByteArrayView QVar16;
  Connection local_80;
  QSize nativeSize;
  QWidget *w_local;
  QPoint p;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  w_local = w;
  bVar5 = QWidget::testAttribute_helper((QWidget *)this,WA_StyleSheet);
  if (!bVar5) {
    if (w_local == (QWidget *)0x0) goto LAB_003a5cfa;
    QWidget::style(w_local);
    lVar6 = QMetaObject::cast((QObject *)&QStyleSheetStyle::staticMetaObject);
    if (lVar6 == 0) goto LAB_003a5cfa;
  }
  pQVar3 = instance;
  ::QVariant::QVariant((QVariant *)&p,(QMetaType)0x8311d8,&w_local);
  QObject::doSetProperty((char *)pQVar3,(QVariant *)"_q_stylesheet_parent",(QVariant *)&p);
  ::QVariant::~QVariant((QVariant *)&p);
  pQVar3 = instance;
  QVar16.m_data = (storage_type *)0x5;
  QVar16.m_size = (qsizetype)&p;
  QString::fromLatin1(QVar16);
  nativeSize.wd.m_i = p.xp.m_i;
  nativeSize.ht.m_i = p.yp.m_i;
  QWidget::setStyleSheet((QWidget *)pQVar3,(QString *)&nativeSize);
  if (nativeSize != (QSize)0x0) {
    LOCK();
    *(int *)nativeSize = *(int *)nativeSize + -1;
    UNLOCK();
    if (*(int *)nativeSize == 0) {
      QArrayData::deallocate((QArrayData *)nativeSize,2,0x10);
    }
  }
  pQVar4 = w_local;
  pQVar3 = instance;
  instance->styleSheetParent = w_local;
  if (w_local != (QWidget *)0x0) {
    nativeSize = (QSize)styleSheetParentDestroyed;
    p = (QPoint)QObject::destroyed;
    puVar7 = (undefined4 *)operator_new(0x20);
    *puVar7 = 1;
    *(code **)(puVar7 + 2) =
         QtPrivate::QCallableObject<void_(QTipLabel::*)(),_QtPrivate::List<>,_void>::impl;
    *(code **)(puVar7 + 4) = styleSheetParentDestroyed;
    *(undefined8 *)(puVar7 + 6) = 0;
    QObject::connectImpl
              ((QObject *)&local_80,(void **)pQVar4,(QObject *)&p,(void **)pQVar3,
               (QSlotObjectBase *)&nativeSize,(ConnectionType)puVar7,(int *)0x0,(QMetaObject *)0x0);
    QMetaObject::Connection::~Connection(&local_80);
  }
  updateSize(instance,pos);
LAB_003a5cfa:
  p = *pos;
  pQVar8 = getTipScreen(pos,w_local);
  if (pQVar8 == (QScreen *)0x0) {
    context = (QPlatformScreen *)0x0;
  }
  else {
    context = (QPlatformScreen *)QScreen::handle();
  }
  if (context != (QPlatformScreen *)0x0) {
    plVar9 = (long *)(**(code **)(*(long *)context + 0xb0))(context);
    nativeSize = (QSize)&DAT_aaaaaaaaaaaaaaaa;
    if (plVar9 == (long *)0x0) {
      nativeSize.wd.m_i = 0x10;
      nativeSize.ht.m_i = 0x10;
    }
    else {
      nativeSize = (QSize)(**(code **)(*plVar9 + 0x90))(plVar9);
    }
    QVar10 = QHighDpi::fromNativePixels<QSize,QPlatformScreen>(&nativeSize,context);
    pQVar2 = (this->super_QLabel).super_QFrame.super_QWidget.data;
    iVar11 = (int)(((uint)((ulong)QVar10 >> 0x1f) & 1) + QVar10.wd.m_i.m_i) >> 1;
    RVar12.m_i = 0;
    if (QVar10.ht.m_i.m_i <= ((pQVar2->crect).y2.m_i - (pQVar2->crect).y1.m_i) * 2 + 2) {
      RVar12.m_i = QVar10.ht.m_i.m_i;
      iVar11 = 2;
    }
    p.yp.m_i = p.yp.m_i + RVar12.m_i;
    p.xp.m_i = p.xp.m_i + iVar11;
    auVar15 = QScreen::geometry();
    pQVar2 = (this->super_QLabel).super_QFrame.super_QWidget.data;
    iVar13 = (pQVar2->crect).x2.m_i - (pQVar2->crect).x1.m_i;
    iVar11 = auVar15._8_4_ + 1;
    if (iVar11 < iVar13 + p.xp.m_i + 1) {
      p.xp.m_i = (p.xp.m_i - (iVar13 + 1)) + -4;
    }
    iVar14 = (pQVar2->crect).y2.m_i - (pQVar2->crect).y1.m_i;
    iVar13 = auVar15._12_4_ + 1;
    if (iVar13 < iVar14 + p.yp.m_i + 1) {
      p.yp.m_i = (p.yp.m_i - (iVar14 + 1)) + -0x18;
    }
    if (p.yp.m_i < auVar15._4_4_) {
      p.yp.m_i = auVar15._4_4_;
    }
    iVar14 = ((pQVar2->crect).x2.m_i - (pQVar2->crect).x1.m_i) + 1;
    if (iVar11 < p.xp.m_i + iVar14) {
      p.xp.m_i = iVar11 - iVar14;
    }
    if (p.xp.m_i < auVar15._0_4_) {
      p.xp.m_i = auVar15._0_4_;
    }
    iVar11 = ((pQVar2->crect).y2.m_i - (pQVar2->crect).y1.m_i) + 1;
    if (iVar13 < p.yp.m_i + iVar11) {
      p.yp.m_i = iVar13 - iVar11;
    }
  }
  QWidget::move((QWidget *)this,&p);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTipLabel::placeTip(const QPoint &pos, QWidget *w)
{
#ifndef QT_NO_STYLE_STYLESHEET
    if (testAttribute(Qt::WA_StyleSheet) || (w && qt_styleSheet(w->style()))) {
        //the stylesheet need to know the real parent
        QTipLabel::instance->setProperty("_q_stylesheet_parent", QVariant::fromValue(w));
        //we force the style to be the QStyleSheetStyle, and force to clear the cache as well.
        QTipLabel::instance->setStyleSheet("/* */"_L1);

        // Set up for cleaning up this later...
        QTipLabel::instance->styleSheetParent = w;
        if (w) {
            connect(w, &QWidget::destroyed,
                    QTipLabel::instance, &QTipLabel::styleSheetParentDestroyed);
        }
        // QTBUG-64550: A font inherited by the style sheet might change the size,
        // particular on Windows, where the tip is not parented on a window.
        // The updatesSize() also makes sure that the content size be updated with
        // correct content margin.
        QTipLabel::instance->updateSize(pos);
    }
#endif //QT_NO_STYLE_STYLESHEET

    QPoint p = pos;
    const QScreen *screen = getTipScreen(pos, w);
    // a QScreen's handle *should* never be null, so this is a bit paranoid
    if (const QPlatformScreen *platformScreen = screen ? screen->handle() : nullptr) {
        QPlatformCursor *cursor = platformScreen->cursor();
        // default implementation of QPlatformCursor::size() returns QSize(16, 16)
        const QSize nativeSize = cursor ? cursor->size() : QSize(16, 16);
        const QSize cursorSize = QHighDpi::fromNativePixels(nativeSize,
                                                            platformScreen);
        QPoint offset(2, cursorSize.height());
        // assuming an arrow shape, we can just move to the side for very large cursors
        if (cursorSize.height() > 2 * this->height())
            offset = QPoint(cursorSize.width() / 2, 0);

        p += offset;

        QRect screenRect = screen->geometry();
        if (p.x() + this->width() > screenRect.x() + screenRect.width())
        p.rx() -= 4 + this->width();
        if (p.y() + this->height() > screenRect.y() + screenRect.height())
        p.ry() -= 24 + this->height();
        if (p.y() < screenRect.y())
            p.setY(screenRect.y());
        if (p.x() + this->width() > screenRect.x() + screenRect.width())
            p.setX(screenRect.x() + screenRect.width() - this->width());
        if (p.x() < screenRect.x())
            p.setX(screenRect.x());
        if (p.y() + this->height() > screenRect.y() + screenRect.height())
            p.setY(screenRect.y() + screenRect.height() - this->height());
    }
    this->move(p);
}